

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
Chainstate::InvalidateBlock(Chainstate *this,BlockValidationState *state,CBlockIndex *pindex)

{
  CChain *this_00;
  set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *this_01;
  _Rb_tree_header *p_Var1;
  long lVar2;
  ValidationSignals *pVVar3;
  pointer ppCVar4;
  Notifications *pNVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  CBlockIndex *pCVar9;
  iterator __position;
  CBlockIndex **ppCVar10;
  __node_base *p_Var11;
  RecursiveMutex *pmutexIn;
  ulong uVar12;
  DisconnectedBlockTransactions *this_02;
  long in_FS_OFFSET;
  CBlockIndexWorkComparator local_119;
  CBlockIndex *invalid_walk_tip;
  CBlockIndex *to_mark_failed;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock30;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock27;
  DisconnectedBlockTransactions disconnectpool;
  multimap<const_arith_uint256,_CBlockIndex_*,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
  candidate_blocks_by_work;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindex == (CBlockIndex *)0x0) {
    __assert_fail("pindex",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xe2d,"bool Chainstate::InvalidateBlock(BlockValidationState &, CBlockIndex *)");
  }
  if (pindex->nHeight == 0) {
    bVar6 = false;
  }
  else {
    to_mark_failed = pindex;
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (&criticalblock27,&this->m_chainstate_mutex,"m_chainstate_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
               ,0xe37,false);
    p_Var1 = &candidate_blocks_by_work._M_t._M_impl.super__Rb_tree_header;
    candidate_blocks_by_work._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    candidate_blocks_by_work._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    candidate_blocks_by_work._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    candidate_blocks_by_work._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    candidate_blocks_by_work._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock28,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
               ,0xe43,false);
    p_Var11 = &(this->m_blockman->m_block_index)._M_h._M_before_begin;
    this_00 = &this->m_chain;
    while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
      pCVar9 = (CBlockIndex *)(p_Var11 + 5);
      bVar6 = CChain::Contains(this_00,pCVar9);
      if (!bVar6) {
        bVar6 = ::node::CBlockIndexWorkComparator::operator()
                          ((CBlockIndexWorkComparator *)&disconnectpool,pCVar9,pindex->pprev);
        if (((!bVar6) &&
            (2 < (*(uint *)&p_Var11[0x10]._M_nxt & 7) &&
             (*(uint *)&p_Var11[0x10]._M_nxt & 0x60) == 0)) &&
           (p_Var11[0xf]._M_nxt != (_Hash_node_base *)0x0)) {
          base_uint<256U>::base_uint
                    ((base_uint<256U> *)&disconnectpool,(base_uint<256U> *)(p_Var11 + 10));
          disconnectpool.queuedTx.
          super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl._M_node._M_size = (size_t)pCVar9;
          std::
          _Rb_tree<arith_uint256_const,std::pair<arith_uint256_const,CBlockIndex*>,std::_Select1st<std::pair<arith_uint256_const,CBlockIndex*>>,std::less<arith_uint256_const>,std::allocator<std::pair<arith_uint256_const,CBlockIndex*>>>
          ::_M_emplace_equal<std::pair<arith_uint256,CBlockIndex*>>
                    ((_Rb_tree<arith_uint256_const,std::pair<arith_uint256_const,CBlockIndex*>,std::_Select1st<std::pair<arith_uint256_const,CBlockIndex*>>,std::less<arith_uint256_const>,std::allocator<std::pair<arith_uint256_const,CBlockIndex*>>>
                      *)&candidate_blocks_by_work,
                     (pair<arith_uint256,_CBlockIndex_*> *)&disconnectpool);
        }
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock28.super_unique_lock);
    this_01 = &this->setBlockIndexCandidates;
    bVar7 = true;
    uVar8 = 0;
    while( true ) {
      bVar6 = util::SignalInterrupt::operator_cast_to_bool(this->m_chainman->m_interrupt);
      if (bVar6) break;
      pVVar3 = (this->m_chainman->m_options).signals;
      if (pVVar3 != (ValidationSignals *)0x0) {
        LimitValidationInterfaceQueue(pVVar3);
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock28,&cs_main,"cs_main",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                 ,0xe5b,false);
      pmutexIn = &this->m_mempool->cs;
      if (this->m_mempool == (CTxMemPool *)0x0) {
        pmutexIn = (RecursiveMutex *)0x0;
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock30,pmutexIn,"MempoolMutex()",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                 ,0xe5e,false);
      bVar6 = CChain::Contains(this_00,pindex);
      if (!bVar6) {
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock30.super_unique_lock);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock28.super_unique_lock);
        break;
      }
      ppCVar4 = (this->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar4 ==
          (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        invalid_walk_tip = (CBlockIndex *)0x0;
      }
      else {
        invalid_walk_tip = ppCVar4[-1];
      }
      DisconnectedBlockTransactions::DisconnectedBlockTransactions(&disconnectpool,20000000);
      bVar6 = DisconnectTip(this,state,&disconnectpool);
      MaybeUpdateMempoolForReorg(this,&disconnectpool,uVar8 < 10 && bVar6);
      if (!bVar6) {
        DisconnectedBlockTransactions::~DisconnectedBlockTransactions(&disconnectpool);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock30.super_unique_lock);
        this_02 = (DisconnectedBlockTransactions *)&criticalblock28;
        goto LAB_008b6520;
      }
      ppCVar4 = (this->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar4 ==
          (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        pCVar9 = (CBlockIndex *)0x0;
      }
      else {
        pCVar9 = ppCVar4[-1];
      }
      if (invalid_walk_tip->pprev != pCVar9) {
        __assert_fail("invalid_walk_tip->pprev == m_chain.Tip()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0xe6e,
                      "bool Chainstate::InvalidateBlock(BlockValidationState &, CBlockIndex *)");
      }
      *(byte *)&invalid_walk_tip->nStatus = (byte)invalid_walk_tip->nStatus | 0x20;
      std::
      _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
      ::_M_insert_unique<CBlockIndex*const&>
                ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                  *)&this->m_blockman->m_dirty_blockindex,&invalid_walk_tip);
      std::
      _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
      ::erase(&this_01->_M_t,&invalid_walk_tip);
      std::
      _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
      ::_M_insert_unique<CBlockIndex*const&>
                ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
                  *)this_01,&invalid_walk_tip->pprev);
      pCVar9 = invalid_walk_tip->pprev;
      if ((pCVar9 == to_mark_failed) && ((to_mark_failed->nStatus & 0x20) != 0)) {
        to_mark_failed->nStatus = to_mark_failed->nStatus & 0xffffff9f | 0x40;
        std::
        _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
        ::_M_insert_unique<CBlockIndex*const&>
                  ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                    *)&this->m_blockman->m_dirty_blockindex,&to_mark_failed);
        pCVar9 = invalid_walk_tip->pprev;
      }
      __position = std::
                   _Rb_tree<const_arith_uint256,_std::pair<const_arith_uint256,_CBlockIndex_*>,_std::_Select1st<std::pair<const_arith_uint256,_CBlockIndex_*>_>,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
                   ::lower_bound((_Rb_tree<const_arith_uint256,_std::pair<const_arith_uint256,_CBlockIndex_*>,_std::_Select1st<std::pair<const_arith_uint256,_CBlockIndex_*>_>,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
                                  *)&candidate_blocks_by_work,&pCVar9->nChainWork);
      uVar8 = uVar8 + 1;
      while ((_Rb_tree_header *)__position._M_node != p_Var1) {
        bVar6 = ::node::CBlockIndexWorkComparator::operator()
                          (&local_119,*(CBlockIndex **)(__position._M_node + 2),
                           invalid_walk_tip->pprev);
        if (bVar6) {
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        }
        else {
          std::
          _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
          ::_M_insert_unique<CBlockIndex*const&>
                    ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
                      *)this_01,(CBlockIndex **)(__position._M_node + 2));
          __position = std::
                       _Rb_tree<arith_uint256_const,std::pair<arith_uint256_const,CBlockIndex*>,std::_Select1st<std::pair<arith_uint256_const,CBlockIndex*>>,std::less<arith_uint256_const>,std::allocator<std::pair<arith_uint256_const,CBlockIndex*>>>
                       ::erase_abi_cxx11_((_Rb_tree<arith_uint256_const,std::pair<arith_uint256_const,CBlockIndex*>,std::_Select1st<std::pair<arith_uint256_const,CBlockIndex*>>,std::less<arith_uint256_const>,std::allocator<std::pair<arith_uint256_const,CBlockIndex*>>>
                                           *)&candidate_blocks_by_work,__position);
        }
      }
      to_mark_failed = invalid_walk_tip;
      DisconnectedBlockTransactions::~DisconnectedBlockTransactions(&disconnectpool);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock30.super_unique_lock);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock28.super_unique_lock);
      bVar7 = false;
    }
    ChainstateManager::CheckBlockIndex(this->m_chainman);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&disconnectpool,&cs_main,
               "cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
               ,0xe93,false);
    bVar6 = CChain::Contains(this_00,to_mark_failed);
    if (bVar6) {
      this_02 = &disconnectpool;
LAB_008b6520:
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)this_02);
      bVar6 = false;
    }
    else {
      to_mark_failed->nStatus = to_mark_failed->nStatus | 0x20;
      std::
      _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
      ::_M_insert_unique<CBlockIndex*const&>
                ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                  *)&this->m_blockman->m_dirty_blockindex,&to_mark_failed);
      std::
      _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
      ::erase(&this_01->_M_t,&to_mark_failed);
      std::
      _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
      ::_M_insert_unique<CBlockIndex*const&>
                ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                  *)&this->m_chainman->m_failed_blocks,&to_mark_failed);
      p_Var11 = &(this->m_blockman->m_block_index)._M_h._M_before_begin;
      while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
        if ((2 < (*(uint *)&p_Var11[0x10]._M_nxt & 7) &&
             (*(uint *)&p_Var11[0x10]._M_nxt & 0x60) == 0) &&
           (p_Var11[0xf]._M_nxt != (_Hash_node_base *)0x0)) {
          ppCVar4 = (this->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppCVar4 ==
              (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pCVar9 = (CBlockIndex *)0x0;
          }
          else {
            pCVar9 = ppCVar4[-1];
          }
          bVar6 = ::node::CBlockIndexWorkComparator::operator()
                            ((CBlockIndexWorkComparator *)&criticalblock28,
                             (CBlockIndex *)(p_Var11 + 5),pCVar9);
          if (!bVar6) {
            criticalblock28.super_unique_lock._M_device = (mutex_type *)(p_Var11 + 5);
            std::
            _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
            ::_M_insert_unique<CBlockIndex*>
                      ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
                        *)this_01,(CBlockIndex **)&criticalblock28);
          }
        }
      }
      InvalidChainFound(this,to_mark_failed);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&disconnectpool);
      bVar6 = true;
      if (!bVar7) {
        pNVar5 = (this->m_chainman->m_options).notifications;
        bVar7 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
        uVar12 = 2;
        if (bVar7) {
          uVar12 = (ulong)((this->m_chainman->m_blockman).m_blockfiles_indexed._M_base._M_i & 1);
        }
        (*pNVar5->_vptr_Notifications[2])(pNVar5,uVar12,to_mark_failed->pprev);
        pVVar3 = (this->m_chainman->m_options).signals;
        if (pVVar3 != (ValidationSignals *)0x0) {
          ppCVar4 = (this->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppCVar4 ==
              (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            disconnectpool.cachedInnerUsage = 0;
          }
          else {
            disconnectpool.cachedInnerUsage = (uint64_t)ppCVar4[-1];
          }
          ppCVar10 = inline_assertion_check<true,CBlockIndex*>
                               ((CBlockIndex **)&disconnectpool,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                ,0xebd,"InvalidateBlock","m_chain.Tip()");
          pCVar9 = *ppCVar10;
          bVar7 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
          ValidationSignals::ActiveTipChange(pVVar3,pCVar9,bVar7);
        }
      }
    }
    std::
    _Rb_tree<const_arith_uint256,_std::pair<const_arith_uint256,_CBlockIndex_*>,_std::_Select1st<std::pair<const_arith_uint256,_CBlockIndex_*>_>,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
    ::~_Rb_tree(&candidate_blocks_by_work._M_t);
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock27.super_unique_lock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::InvalidateBlock(BlockValidationState& state, CBlockIndex* pindex)
{
    AssertLockNotHeld(m_chainstate_mutex);
    AssertLockNotHeld(::cs_main);

    // Genesis block can't be invalidated
    assert(pindex);
    if (pindex->nHeight == 0) return false;

    CBlockIndex* to_mark_failed = pindex;
    bool pindex_was_in_chain = false;
    int disconnected = 0;

    // We do not allow ActivateBestChain() to run while InvalidateBlock() is
    // running, as that could cause the tip to change while we disconnect
    // blocks.
    LOCK(m_chainstate_mutex);

    // We'll be acquiring and releasing cs_main below, to allow the validation
    // callbacks to run. However, we should keep the block index in a
    // consistent state as we disconnect blocks -- in particular we need to
    // add equal-work blocks to setBlockIndexCandidates as we disconnect.
    // To avoid walking the block index repeatedly in search of candidates,
    // build a map once so that we can look up candidate blocks by chain
    // work as we go.
    std::multimap<const arith_uint256, CBlockIndex *> candidate_blocks_by_work;

    {
        LOCK(cs_main);
        for (auto& entry : m_blockman.m_block_index) {
            CBlockIndex* candidate = &entry.second;
            // We don't need to put anything in our active chain into the
            // multimap, because those candidates will be found and considered
            // as we disconnect.
            // Instead, consider only non-active-chain blocks that have at
            // least as much work as where we expect the new tip to end up.
            if (!m_chain.Contains(candidate) &&
                    !CBlockIndexWorkComparator()(candidate, pindex->pprev) &&
                    candidate->IsValid(BLOCK_VALID_TRANSACTIONS) &&
                    candidate->HaveNumChainTxs()) {
                candidate_blocks_by_work.insert(std::make_pair(candidate->nChainWork, candidate));
            }
        }
    }

    // Disconnect (descendants of) pindex, and mark them invalid.
    while (true) {
        if (m_chainman.m_interrupt) break;

        // Make sure the queue of validation callbacks doesn't grow unboundedly.
        if (m_chainman.m_options.signals) LimitValidationInterfaceQueue(*m_chainman.m_options.signals);

        LOCK(cs_main);
        // Lock for as long as disconnectpool is in scope to make sure MaybeUpdateMempoolForReorg is
        // called after DisconnectTip without unlocking in between
        LOCK(MempoolMutex());
        if (!m_chain.Contains(pindex)) break;
        pindex_was_in_chain = true;
        CBlockIndex *invalid_walk_tip = m_chain.Tip();

        // ActivateBestChain considers blocks already in m_chain
        // unconditionally valid already, so force disconnect away from it.
        DisconnectedBlockTransactions disconnectpool{MAX_DISCONNECTED_TX_POOL_BYTES};
        bool ret = DisconnectTip(state, &disconnectpool);
        // DisconnectTip will add transactions to disconnectpool.
        // Adjust the mempool to be consistent with the new tip, adding
        // transactions back to the mempool if disconnecting was successful,
        // and we're not doing a very deep invalidation (in which case
        // keeping the mempool up to date is probably futile anyway).
        MaybeUpdateMempoolForReorg(disconnectpool, /* fAddToMempool = */ (++disconnected <= 10) && ret);
        if (!ret) return false;
        assert(invalid_walk_tip->pprev == m_chain.Tip());

        // We immediately mark the disconnected blocks as invalid.
        // This prevents a case where pruned nodes may fail to invalidateblock
        // and be left unable to start as they have no tip candidates (as there
        // are no blocks that meet the "have data and are not invalid per
        // nStatus" criteria for inclusion in setBlockIndexCandidates).
        invalid_walk_tip->nStatus |= BLOCK_FAILED_VALID;
        m_blockman.m_dirty_blockindex.insert(invalid_walk_tip);
        setBlockIndexCandidates.erase(invalid_walk_tip);
        setBlockIndexCandidates.insert(invalid_walk_tip->pprev);
        if (invalid_walk_tip->pprev == to_mark_failed && (to_mark_failed->nStatus & BLOCK_FAILED_VALID)) {
            // We only want to mark the last disconnected block as BLOCK_FAILED_VALID; its children
            // need to be BLOCK_FAILED_CHILD instead.
            to_mark_failed->nStatus = (to_mark_failed->nStatus ^ BLOCK_FAILED_VALID) | BLOCK_FAILED_CHILD;
            m_blockman.m_dirty_blockindex.insert(to_mark_failed);
        }

        // Add any equal or more work headers to setBlockIndexCandidates
        auto candidate_it = candidate_blocks_by_work.lower_bound(invalid_walk_tip->pprev->nChainWork);
        while (candidate_it != candidate_blocks_by_work.end()) {
            if (!CBlockIndexWorkComparator()(candidate_it->second, invalid_walk_tip->pprev)) {
                setBlockIndexCandidates.insert(candidate_it->second);
                candidate_it = candidate_blocks_by_work.erase(candidate_it);
            } else {
                ++candidate_it;
            }
        }

        // Track the last disconnected block, so we can correct its BLOCK_FAILED_CHILD status in future
        // iterations, or, if it's the last one, call InvalidChainFound on it.
        to_mark_failed = invalid_walk_tip;
    }

    m_chainman.CheckBlockIndex();

    {
        LOCK(cs_main);
        if (m_chain.Contains(to_mark_failed)) {
            // If the to-be-marked invalid block is in the active chain, something is interfering and we can't proceed.
            return false;
        }

        // Mark pindex (or the last disconnected block) as invalid, even when it never was in the main chain
        to_mark_failed->nStatus |= BLOCK_FAILED_VALID;
        m_blockman.m_dirty_blockindex.insert(to_mark_failed);
        setBlockIndexCandidates.erase(to_mark_failed);
        m_chainman.m_failed_blocks.insert(to_mark_failed);

        // If any new blocks somehow arrived while we were disconnecting
        // (above), then the pre-calculation of what should go into
        // setBlockIndexCandidates may have missed entries. This would
        // technically be an inconsistency in the block index, but if we clean
        // it up here, this should be an essentially unobservable error.
        // Loop back over all block index entries and add any missing entries
        // to setBlockIndexCandidates.
        for (auto& [_, block_index] : m_blockman.m_block_index) {
            if (block_index.IsValid(BLOCK_VALID_TRANSACTIONS) && block_index.HaveNumChainTxs() && !setBlockIndexCandidates.value_comp()(&block_index, m_chain.Tip())) {
                setBlockIndexCandidates.insert(&block_index);
            }
        }

        InvalidChainFound(to_mark_failed);
    }

    // Only notify about a new block tip if the active chain was modified.
    if (pindex_was_in_chain) {
        // Ignoring return value for now, this could be changed to bubble up
        // kernel::Interrupted value to the caller so the caller could
        // distinguish between completed and interrupted operations. It might
        // also make sense for the blockTip notification to have an enum
        // parameter indicating the source of the tip change so hooks can
        // distinguish user-initiated invalidateblock changes from other
        // changes.
        (void)m_chainman.GetNotifications().blockTip(GetSynchronizationState(m_chainman.IsInitialBlockDownload(), m_chainman.m_blockman.m_blockfiles_indexed), *to_mark_failed->pprev);

        // Fire ActiveTipChange now for the current chain tip to make sure clients are notified.
        // ActivateBestChain may call this as well, but not necessarily.
        if (m_chainman.m_options.signals) {
            m_chainman.m_options.signals->ActiveTipChange(*Assert(m_chain.Tip()), m_chainman.IsInitialBlockDownload());
        }
    }
    return true;
}